

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  ReflectionSchema *this_00;
  uint uVar1;
  Descriptor *expected;
  bool bVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  UnknownFieldSet *this_01;
  size_t sVar5;
  size_t sVar6;
  FieldDescriptor *this_02;
  RepeatedField<int> *this_03;
  OneofDescriptor *pOVar7;
  Cord **ppCVar8;
  Message **ppMVar9;
  string *str;
  RepeatedField<unsigned_long> *this_04;
  MapFieldBase *this_05;
  RepeatedField<long> *this_06;
  RepeatedField<unsigned_int> *this_07;
  RepeatedField<bool> *this_08;
  RepeatedField<double> *this_09;
  RepeatedField<float> *this_10;
  RepeatedField<absl::lts_20250127::Cord> *this_11;
  ArenaStringPtr *pAVar10;
  RepeatedPtrFieldBase *pRVar11;
  Cord *this_12;
  int i;
  int index;
  void *pvVar12;
  Metadata MVar13;
  
  MVar13 = Message::GetMetadata(message);
  if (MVar13.reflection != this) {
    expected = this->descriptor_;
    MVar13 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar13.descriptor,(FieldDescriptor *)0x0,"SpaceUsedLong");
  }
  this_00 = &this->schema_;
  uVar1 = (this->schema_).object_size_;
  this_01 = GetUnknownFields(this,message);
  sVar5 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_01);
  sVar5 = sVar5 + uVar1;
  if ((this->schema_).extensions_offset_ != -1) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    sVar6 = internal::ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3));
    sVar5 = sVar5 + sVar6;
  }
  index = 0;
  do {
    if (this->last_non_weak_field_index_ < index) {
      return sVar5;
    }
    this_02 = Descriptor::field(this->descriptor_,index);
    bVar2 = FieldDescriptor::is_repeated(this_02);
    if (bVar2) {
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4)) {
      case 1:
      case 8:
        this_03 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_02);
        sVar6 = RepeatedField<int>::SpaceUsedExcludingSelfLong(this_03);
        break;
      case 2:
        this_06 = GetRaw<google::protobuf::RepeatedField<long>>(this,message,this_02);
        sVar6 = RepeatedField<long>::SpaceUsedExcludingSelfLong(this_06);
        break;
      case 3:
        this_07 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,this_02);
        sVar6 = RepeatedField<unsigned_int>::SpaceUsedExcludingSelfLong(this_07);
        break;
      case 4:
        this_04 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,this_02);
        sVar6 = RepeatedField<unsigned_long>::SpaceUsedExcludingSelfLong(this_04);
        break;
      case 5:
        this_09 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,this_02);
        sVar6 = RepeatedField<double>::SpaceUsedExcludingSelfLong(this_09);
        break;
      case 6:
        this_10 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,this_02);
        sVar6 = RepeatedField<float>::SpaceUsedExcludingSelfLong(this_10);
        break;
      case 7:
        this_08 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,this_02);
        sVar6 = RepeatedField<bool>::SpaceUsedExcludingSelfLong(this_08);
        break;
      case 9:
        CVar4 = FieldDescriptor::cpp_string_type(this_02);
        if ((CVar4 == kView) || (CVar4 == kString)) {
          pRVar11 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               (this,message,this_02)->super_RepeatedPtrFieldBase;
          sVar6 = internal::RepeatedPtrFieldBase::
                  SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (pRVar11);
        }
        else {
          if (CVar4 != kCord) goto switchD_0024c709_default;
          this_11 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,this_02);
          sVar6 = RepeatedField<absl::lts_20250127::Cord>::SpaceUsedExcludingSelfLong(this_11);
        }
        break;
      case 10:
        bVar2 = FieldDescriptor::is_map(this_02);
        if (bVar2) {
          this_05 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,this_02);
          sVar6 = internal::MapFieldBase::SpaceUsedExcludingSelfLong(this_05);
        }
        else {
          pRVar11 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,this_02);
          sVar6 = internal::RepeatedPtrFieldBase::
                  SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                            (pRVar11);
        }
        break;
      default:
        goto switchD_0024c709_default;
      }
LAB_0024c973:
      sVar5 = sVar5 + sVar6;
    }
    else {
      pOVar7 = FieldDescriptor::real_containing_oneof(this_02);
      if ((pOVar7 == (OneofDescriptor *)0x0) || (bVar2 = HasOneofField(this,message,this_02), bVar2)
         ) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4) == 10) {
          if (this_00->default_instance_ != message) {
            ppMVar9 = GetRaw<google::protobuf::Message_const*>(this,message,this_02);
            if (*ppMVar9 != (Message *)0x0) {
              sVar6 = Message::SpaceUsedLong(*ppMVar9);
              goto LAB_0024c973;
            }
          }
        }
        else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_02->type_ * 4) == 9) {
          CVar4 = FieldDescriptor::cpp_string_type(this_02);
          if ((CVar4 == kView) || (CVar4 == kString)) {
            bVar2 = internal::ReflectionSchema::IsFieldInlined(this_00,this_02);
            if (bVar2) {
              str = (string *)
                    GetRaw<google::protobuf::internal::InlinedStringField>(this,message,this_02);
              sVar6 = internal::StringSpaceUsedExcludingSelfLong(str);
              goto LAB_0024c973;
            }
            pAVar10 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,this_02);
            pvVar12 = (pAVar10->tagged_ptr_).ptr_;
            if (((ulong)pvVar12 & 3) == 0) {
              pOVar7 = FieldDescriptor::real_containing_oneof(this_02);
              if (pOVar7 == (OneofDescriptor *)0x0) goto switchD_0024c709_default;
              pvVar12 = (pAVar10->tagged_ptr_).ptr_;
            }
            sVar6 = internal::StringSpaceUsedExcludingSelfLong
                              ((string *)((ulong)pvVar12 & 0xfffffffffffffffc));
            sVar5 = sVar5 + sVar6 + 0x20;
          }
          else if (CVar4 == kCord) {
            pOVar7 = FieldDescriptor::real_containing_oneof(this_02);
            if (pOVar7 != (OneofDescriptor *)0x0) {
              ppCVar8 = GetRaw<absl::lts_20250127::Cord*>(this,message,this_02);
              sVar6 = absl::lts_20250127::Cord::EstimatedMemoryUsage(*ppCVar8,kTotal);
              goto LAB_0024c973;
            }
            this_12 = GetRaw<absl::lts_20250127::Cord>(this,message,this_02);
            sVar6 = absl::lts_20250127::Cord::EstimatedMemoryUsage(this_12,kTotal);
            sVar5 = (sVar5 + sVar6) - 0x10;
          }
        }
      }
    }
switchD_0024c709_default:
    index = index + 1;
  } while( true );
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  STATIC_USAGE_CHECK_MESSAGE(SpaceUsedLong, &message);
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              total_size += GetRaw<RepeatedField<absl::Cord>>(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (schema_.InRealOneof(field)) {
                total_size += GetField<absl::Cord*>(message, field)
                                  ->EstimatedMemoryUsage();

              } else {
                // sizeof(absl::Cord) is included to self.
                total_size += GetField<absl::Cord>(message, field)
                                  .EstimatedMemoryUsage() -
                              sizeof(absl::Cord);
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
              } else if (IsMicroString(field)) {
                total_size += GetField<MicroString>(message, field)
                                  .SpaceUsedExcludingSelfLong();
              } else {
                // Initially, the string points to the default value stored
                // in the prototype. Only count the string if it has been
                // changed from the default value.
                // Except oneof fields, those never point to a default instance,
                // and there is no default instance to point to.
                const auto& str = GetField<ArenaStringPtr>(message, field);
                if (!str.IsDefault() || schema_.InRealOneof(field)) {
                  // string fields are represented by just a pointer, so also
                  // include sizeof(string) as well.
                  total_size += sizeof(std::string) +
                                StringSpaceUsedExcludingSelfLong(str.Get());
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  if (internal::DebugHardenFuzzMessageSpaceUsedLong()) {
    // Use both `this` and `dummy` to generate the seed so that the scale factor
    // is both per-object and non-predictable, but consistent across multiple
    // calls in the same binary.
    static bool dummy;
    uintptr_t seed =
        reinterpret_cast<uintptr_t>(&dummy) ^ reinterpret_cast<uintptr_t>(this);
    // Fuzz the size by +/- 50%.
    double scale = (static_cast<double>(seed % 10000) / 10000) + 0.5;
    return total_size * scale;
  } else {
    return total_size;
  }
}